

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.cpp
# Opt level: O3

bool __thiscall QBasicMutex::lockInternal(QBasicMutex *this,QDeadlineTimer deadlineTimer)

{
  __pointer_type pQVar1;
  bool bVar2;
  bool bVar3;
  qint64 qVar4;
  long lVar5;
  int *piVar6;
  long in_FS_OFFSET;
  QDeadlineTimer local_68;
  long local_58;
  long local_50;
  QDeadlineTimer local_48;
  long local_38;
  
  local_68._8_8_ = deadlineTimer._8_8_;
  local_68.t1 = deadlineTimer.t1;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QDeadlineTimer::hasExpired(&local_68);
  if (!bVar2) {
    if (local_68.t1 == 0x7fffffffffffffff) {
      lockInternal(this);
      bVar2 = true;
      goto LAB_003c5437;
    }
    LOCK();
    pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
    (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x3;
    UNLOCK();
    bVar2 = true;
    if (pQVar1 == (__pointer_type)0x0) goto LAB_003c5437;
    do {
      local_48.t1 = local_68.t1;
      local_48.t2 = local_68.t2;
      local_48.type = local_68.type;
      qVar4 = QDeadlineTimer::deadlineNSecs(&local_48);
      local_58 = qVar4 / 1000000000;
      local_50 = qVar4 % 1000000000;
      lVar5 = syscall(0xca,this,0x89,3,&local_58,0,0xffffffff);
      if ((lVar5 != 0) && (piVar6 = __errno_location(), *piVar6 == 0x6e)) break;
      LOCK();
      pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
      (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x3;
      UNLOCK();
      if (pQVar1 == (__pointer_type)0x0) goto LAB_003c5437;
      bVar3 = QDeadlineTimer::hasExpired(&local_68);
    } while (!bVar3);
  }
  bVar2 = false;
LAB_003c5437:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

Q_NEVER_INLINE
bool QBasicMutex::lockInternal(QDeadlineTimer deadlineTimer) noexcept(FutexAlwaysAvailable)
{
    if (deadlineTimer.hasExpired())
        return false;

    if (futexAvailable()) {
        if (Q_UNLIKELY(deadlineTimer.isForever())) {
            lockInternal();
            return true;
        }

        // The mutex is already locked, set a bit indicating we're waiting.
        // Note we must set to dummyFutexValue because there could be other threads
        // also waiting.
        if (d_ptr.fetchAndStoreAcquire(dummyFutexValue()) == nullptr)
            return true;

        for (;;) {
            if (!futexWait(d_ptr, dummyFutexValue(), deadlineTimer))
                return false;

            // We got woken up, so must try to acquire the mutex. We must set
            // to dummyFutexValue() again because there could be other threads
            // waiting.
            if (d_ptr.fetchAndStoreAcquire(dummyFutexValue()) == nullptr)
                return true;

            if (deadlineTimer.hasExpired())
                return false;
        }
    }

#if !defined(QT_ALWAYS_USE_FUTEX)
    while (!fastTryLock()) {
        QMutexPrivate *copy = d_ptr.loadAcquire();
        if (!copy) // if d is 0, the mutex is unlocked
            continue;

        if (copy == dummyLocked()) {
            if (deadlineTimer.hasExpired())
                return false;
            // The mutex is locked but does not have a QMutexPrivate yet.
            // we need to allocate a QMutexPrivate
            QMutexPrivate *newD = QMutexPrivate::allocate();
            if (!d_ptr.testAndSetOrdered(dummyLocked(), newD)) {
                //Either the mutex is already unlocked, or another thread already set it.
                newD->deref();
                continue;
            }
            copy = newD;
            //the d->refCount is already 1 the deref will occurs when we unlock
        }

        QMutexPrivate *d = static_cast<QMutexPrivate *>(copy);
        if (deadlineTimer.hasExpired() && !d->possiblyUnlocked.loadRelaxed())
            return false;

        // At this point we have a pointer to a QMutexPrivate. But the other thread
        // may unlock the mutex at any moment and release the QMutexPrivate to the pool.
        // We will try to reference it to avoid unlock to release it to the pool to make
        // sure it won't be released. But if the refcount is already 0 it has been released.
        if (!d->ref())
            continue; //that QMutexPrivate was already released

        // We now hold a reference to the QMutexPrivate. It won't be released and re-used.
        // But it is still possible that it was already re-used by another QMutex right before
        // we did the ref(). So check if we still hold a pointer to the right mutex.
        if (d != d_ptr.loadAcquire()) {
            //Either the mutex is already unlocked, or relocked with another mutex
            d->deref();
            continue;
        }

        // In this part, we will try to increment the waiters count.
        // We just need to take care of the case in which the old_waiters
        // is set to the BigNumber magic value set in unlockInternal()
        int old_waiters;
        do {
            old_waiters = d->waiters.loadAcquire();
            if (old_waiters == -QMutexPrivate::BigNumber) {
                // we are unlocking, and the thread that unlocks is about to change d to 0
                // we try to acquire the mutex by changing to dummyLocked()
                if (d_ptr.testAndSetAcquire(d, dummyLocked())) {
                    // Mutex acquired
                    d->deref();
                    return true;
                } else {
                    Q_ASSERT(d != d_ptr.loadRelaxed()); //else testAndSetAcquire should have succeeded
                    // Mutex is likely to bo 0, we should continue the outer-loop,
                    //  set old_waiters to the magic value of BigNumber
                    old_waiters = QMutexPrivate::BigNumber;
                    break;
                }
            }
        } while (!d->waiters.testAndSetRelaxed(old_waiters, old_waiters + 1));

        if (d != d_ptr.loadAcquire()) {
            // The mutex was unlocked before we incremented waiters.
            if (old_waiters != QMutexPrivate::BigNumber) {
                //we did not break the previous loop
                Q_ASSERT(d->waiters.loadRelaxed() >= 1);
                d->waiters.deref();
            }
            d->deref();
            continue;
        }

        if (d->wait(deadlineTimer)) {
            // reset the possiblyUnlocked flag if needed (and deref its corresponding reference)
            if (d->possiblyUnlocked.loadRelaxed() && d->possiblyUnlocked.testAndSetRelaxed(true, false))
                d->deref();
            d->derefWaiters(1);
            //we got the lock. (do not deref)
            Q_ASSERT(d == d_ptr.loadRelaxed());
            return true;
        } else {
            // timed out
            d->derefWaiters(1);
            //There may be a race in which the mutex is unlocked right after we timed out,
            // and before we deref the waiters, so maybe the mutex is actually unlocked.
            // Set the possiblyUnlocked flag to indicate this possibility.
            if (!d->possiblyUnlocked.testAndSetRelaxed(false, true)) {
                // We keep a reference when possiblyUnlocked is true.
                // but if possiblyUnlocked was already true, we don't need to keep the reference.
                d->deref();
            }
            return false;
        }
    }
    Q_ASSERT(d_ptr.loadRelaxed() != 0);
    return true;
#else
    Q_UNREACHABLE();
#endif
}